

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O1

void __thiscall
VectorSUnitTest_element_access_at_Test::TestBody(VectorSUnitTest_element_access_at_Test *this)

{
  bool bVar1;
  reference pvVar2;
  const_reference pvVar3;
  pointer *__ptr;
  char *pcVar4;
  AssertionResult gtest_ar_5;
  vector_s<unsigned_int,_5UL> vc;
  vector_s<unsigned_int,_5UL> v;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_c0;
  long local_b8 [3];
  AssertHelper local_a0;
  initializer_list<unsigned_int> local_98 [2];
  undefined1 local_78 [8];
  char *pcStack_70;
  long local_68 [4];
  vector_s<unsigned_int,_5UL> local_48;
  
  local_c8 = (undefined1  [8])local_78;
  local_78 = (undefined1  [8])0x100000000;
  pcStack_70 = &DAT_300000002;
  local_68[0] = CONCAT44(local_68[0]._4_4_,4);
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005;
  estl::vector_s<unsigned_int,_5UL>::vector_s(&local_48,(initializer_list<unsigned_int> *)local_c8);
  local_c8 = (undefined1  [8])((ulong)local_c8 & 0xffffffff00000000);
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&local_48,0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"0u","v.at(0)",(uint *)local_c8,pvVar2);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)pcStack_70)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x150,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pcStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70);
  }
  local_c8._0_4_ = 1;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&local_48,1);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"1u","v.at(1)",(uint *)local_c8,pvVar2);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)pcStack_70)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x151,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pcStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70);
  }
  local_c8._0_4_ = 2;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&local_48,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"2u","v.at(2)",(uint *)local_c8,pvVar2);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)pcStack_70)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x152,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pcStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70);
  }
  local_c8._0_4_ = 3;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&local_48,3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"3u","v.at(3)",(uint *)local_c8,pvVar2);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)pcStack_70)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x153,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pcStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70);
  }
  local_c8._0_4_ = 4;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&local_48,4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"4u","v.at(4)",(uint *)local_c8,pvVar2);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)pcStack_70)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x154,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pcStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_70);
  }
  local_68[1]._0_1_ = '\0';
  local_68[1]._1_1_ = '\0';
  local_68[1]._2_1_ = '\0';
  local_68[1]._3_1_ = '\0';
  local_68[1]._4_4_ = 0;
  pcStack_70 = (char *)0x0;
  local_68[0] = 0;
  local_78 = (undefined1  [8])local_68;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    estl::vector_s<unsigned_int,_5UL>::at(&local_48,5);
  }
  std::__cxx11::string::_M_replace((ulong)local_78,0,pcStack_70,0x159232);
  testing::Message::Message((Message *)local_c8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
             ,0x155,(char *)local_78);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
  if (local_c8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_c8 + 8))();
  }
  if (local_78 != (undefined1  [8])local_68) {
    operator_delete((void *)local_78,local_68[0] + 1);
  }
  local_c8 = (undefined1  [8])0x100000000;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_300000002;
  local_b8[0] = CONCAT44(local_b8[0]._4_4_,4);
  local_98[0]._M_len = 5;
  local_98[0]._M_array = (iterator)local_c8;
  estl::vector_s<unsigned_int,_5UL>::vector_s((vector_s<unsigned_int,_5UL> *)local_78,local_98);
  local_98[0]._M_array = (iterator)((ulong)local_98[0]._M_array & 0xffffffff00000000);
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_c8,"0u","vc.at(0)",(uint *)local_98,pvVar3);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (pbStack_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x159,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98[0]._M_array != (iterator)0x0) {
      (**(code **)(*(long *)local_98[0]._M_array + 8))();
    }
  }
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_c0,pbStack_c0);
  }
  local_98[0]._M_array = (iterator)CONCAT44(local_98[0]._M_array._4_4_,1);
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,1);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_c8,"1u","vc.at(1)",(uint *)local_98,pvVar3);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (pbStack_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98[0]._M_array != (iterator)0x0) {
      (**(code **)(*(long *)local_98[0]._M_array + 8))();
    }
  }
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_c0,pbStack_c0);
  }
  local_98[0]._M_array = (iterator)CONCAT44(local_98[0]._M_array._4_4_,2);
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_c8,"2u","vc.at(2)",(uint *)local_98,pvVar3);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (pbStack_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98[0]._M_array != (iterator)0x0) {
      (**(code **)(*(long *)local_98[0]._M_array + 8))();
    }
  }
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_c0,pbStack_c0);
  }
  local_98[0]._M_array = (iterator)CONCAT44(local_98[0]._M_array._4_4_,3);
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_c8,"3u","vc.at(3)",(uint *)local_98,pvVar3);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (pbStack_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98[0]._M_array != (iterator)0x0) {
      (**(code **)(*(long *)local_98[0]._M_array + 8))();
    }
  }
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_c0,pbStack_c0);
  }
  local_98[0]._M_array = (iterator)CONCAT44(local_98[0]._M_array._4_4_,4);
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_c8,"4u","vc.at(4)",(uint *)local_98,pvVar3);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (pbStack_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98[0]._M_array != (iterator)0x0) {
      (**(code **)(*(long *)local_98[0]._M_array + 8))();
    }
  }
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_c0,pbStack_c0);
  }
  local_b8[1] = 0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8[0] = 0;
  local_c8 = (undefined1  [8])local_b8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_78,5);
  }
  std::__cxx11::string::_M_replace((ulong)local_c8,0,(char *)pbStack_c0,0x15937c);
  testing::Message::Message((Message *)local_98);
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
             ,0x15e,(char *)local_c8);
  testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  if (local_98[0]._M_array != (iterator)0x0) {
    (**(code **)(*(long *)local_98[0]._M_array + 8))();
  }
  if (local_c8 != (undefined1  [8])local_b8) {
    operator_delete((void *)local_c8,local_b8[0] + 1);
  }
  return;
}

Assistant:

TEST_F(VectorSUnitTest, element_access_at)
{
    vector_s<unsigned, 5> v{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, v.at(0));
    EXPECT_EQ(1u, v.at(1));
    EXPECT_EQ(2u, v.at(2));
    EXPECT_EQ(3u, v.at(3));
    EXPECT_EQ(4u, v.at(4));
    EXPECT_THROW(v.at(5), std::out_of_range);

    // const variant of at()
    const vector_s<unsigned, 5> vc{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, vc.at(0));
    EXPECT_EQ(1u, vc.at(1));
    EXPECT_EQ(2u, vc.at(2));
    EXPECT_EQ(3u, vc.at(3));
    EXPECT_EQ(4u, vc.at(4));
    EXPECT_THROW(vc.at(5), std::out_of_range);
}